

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlatest.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  uint uVar4;
  uint32_t uVar5;
  int iVar6;
  ostream *poVar7;
  void *pvVar8;
  char *pcVar9;
  unsigned_long uVar10;
  ulong uVar11;
  undefined8 uVar12;
  allocator<char> local_13e9;
  int c;
  string local_13c8 [8];
  string stringLine;
  char line [80];
  int local_134c;
  string local_1348 [4];
  int cur_line;
  byte local_1325;
  int local_1324;
  undefined4 uStack_1320;
  bool done;
  int last_debug_line;
  int DEBUG_START_LINE;
  int TEST_START_LINE;
  Amp1394Console console;
  string FPGA_SN;
  ostream aoStack_12e0 [4];
  uint fpgaVer;
  ofstream logFile;
  string local_10e0;
  char local_10b9;
  undefined1 local_10b8 [7];
  char resp;
  string QLA_SN;
  string local_1090 [8];
  string logFilename;
  AmpIO Board;
  undefined1 local_210 [7];
  bool isDQLA;
  BasePort *local_1f0;
  BasePort *Port;
  stringstream debugStream;
  ostream local_1d8 [376];
  undefined4 local_60;
  int local_4c;
  string local_48 [4];
  int args_found;
  string portDescription;
  uint local_20;
  uint qlaNum;
  int board;
  int i;
  char **argv_local;
  int argc_local;
  
  argv_local._4_4_ = 0;
  local_20 = 0;
  portDescription.field_2._12_4_ = 0;
  BasePort::DefaultPort_abi_cxx11_();
  if (1 < argc) {
    local_4c = 0;
    for (qlaNum = 1; (int)qlaNum < argc; qlaNum = qlaNum + 1) {
      if (*argv[(int)qlaNum] == '-') {
        if (argv[(int)qlaNum][1] == 'p') {
          std::__cxx11::string::operator=(local_48,argv[(int)qlaNum] + 2);
        }
        else {
          if (argv[(int)qlaNum][1] != 'q') {
            poVar7 = std::operator<<((ostream *)&std::cerr,
                                     "Usage: qlatest [<board-num>] [-pP] [-qN]");
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,
                                     "       where <board-num> = rotary switch setting (0-15, default 0)"
                                    );
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,"             P = port number (default 0)");
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,
                                     "                 can also specify -pfwP, -pethP or -pudp");
            poVar7 = (ostream *)
                     std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            poVar7 = std::operator<<(poVar7,"             N = QLA number (1 or 2) on DQLA");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
            argv_local._4_4_ = 0;
            local_60 = 1;
            goto LAB_0010be3b;
          }
          portDescription.field_2._12_4_ = argv[(int)qlaNum][2] + -0x30;
        }
      }
      else {
        if (local_4c == 0) {
          local_20 = atoi(argv[(int)qlaNum]);
          poVar7 = std::operator<<((ostream *)&std::cerr,"Selecting board ");
          pvVar8 = (void *)std::ostream::operator<<(poVar7,local_20);
          std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        }
        local_4c = local_4c + 1;
      }
    }
  }
  _Var3 = std::operator|(_S_out,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)&Port,_Var3);
  pcVar9 = (char *)std::__cxx11::string::c_str();
  local_1f0 = PortFactory(pcVar9,local_1d8);
  if (local_1f0 == (BasePort *)0x0) {
    PrintDebugStream((stringstream *)&Port);
    poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to create port using: ");
    poVar7 = std::operator<<(poVar7,local_48);
    std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
    argv_local._4_4_ = -1;
    local_60 = 1;
  }
  else {
    uVar4 = (*local_1f0->_vptr_BasePort[0x11])();
    if ((uVar4 & 1) == 0) {
      PrintDebugStream((stringstream *)&Port);
      poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to initialize ");
      BasePort::GetPortTypeString_abi_cxx11_((string *)local_210,local_1f0);
      poVar7 = std::operator<<(poVar7,(string *)local_210);
      std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
      std::__cxx11::string::~string((string *)local_210);
      argv_local._4_4_ = -1;
      local_60 = 1;
    }
    else {
      uVar10 = BasePort::GetHardwareVersion(local_1f0,(byte)local_20);
      if (uVar10 == 0x44514c41) {
        if ((portDescription.field_2._12_4_ != 1) && (portDescription.field_2._12_4_ != 2)) {
          poVar7 = std::operator<<((ostream *)&std::cerr,
                                   "Must specify -q1 or -q2 to select QLA number for DQLA");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          if (local_1f0 != (BasePort *)0x0) {
            (*local_1f0->_vptr_BasePort[0xb])();
          }
          argv_local._4_4_ = 0;
          local_60 = 1;
          goto LAB_0010be2f;
        }
      }
      else if (portDescription.field_2._12_4_ != 0) {
        portDescription.field_2._12_4_ = 0;
      }
      AmpIO::AmpIO((AmpIO *)((long)&logFilename.field_2 + 8),(byte)local_20);
      (*local_1f0->_vptr_BasePort[0xd])(local_1f0,(undefined1 *)((long)&logFilename.field_2 + 8));
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (local_1090,"QLA_",(allocator<char> *)(QLA_SN.field_2._M_local_buf + 0xf));
      std::allocator<char>::~allocator((allocator<char> *)(QLA_SN.field_2._M_local_buf + 0xf));
      AmpIO::GetQLASerialNumber_abi_cxx11_
                ((string *)local_10b8,(AmpIO *)((long)&logFilename.field_2 + 8),
                 portDescription.field_2._M_local_buf[0xc]);
      uVar11 = std::__cxx11::string::empty();
      if ((uVar11 & 1) != 0) {
        std::operator<<((ostream *)&std::cerr,"QLA serial number not found. Program now (y/n)? ");
        iVar6 = getchar();
        local_10b9 = (char)iVar6;
        std::ostream::operator<<(&std::cerr,std::endl<char,std::char_traits<char>>);
        if ((local_10b9 == 'y') || (local_10b9 == 'Y')) {
          bVar2 = PromQLASerialNumberProgram
                            ((AmpIO *)((long)&logFilename.field_2 + 8),
                             portDescription.field_2._M_local_buf[0xc]);
          if (bVar2) {
            AmpIO::GetQLASerialNumber_abi_cxx11_
                      (&local_10e0,(AmpIO *)((long)&logFilename.field_2 + 8),
                       portDescription.field_2._M_local_buf[0xc]);
            std::__cxx11::string::operator=((string *)local_10b8,(string *)&local_10e0);
            std::__cxx11::string::~string((string *)&local_10e0);
          }
          else {
            poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to program QLA serial number");
            std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          }
        }
        uVar11 = std::__cxx11::string::empty();
        if ((uVar11 & 1) != 0) {
          std::__cxx11::string::assign(local_10b8);
        }
      }
      std::__cxx11::string::append(local_1090);
      std::__cxx11::string::append((char *)local_1090);
      pcVar9 = (char *)std::__cxx11::string::c_str();
      std::ofstream::ofstream(aoStack_12e0,pcVar9,_S_out);
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) {
        poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to open log file ");
        poVar7 = std::operator<<(poVar7,local_1090);
        std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        (*local_1f0->_vptr_BasePort[0xe])(local_1f0,(ulong)(byte)local_20);
        if (local_1f0 != (BasePort *)0x0) {
          (*local_1f0->_vptr_BasePort[0xb])();
        }
        argv_local._4_4_ = 0;
        local_60 = 1;
      }
      else {
        poVar7 = std::operator<<(aoStack_12e0,"====== TEST REPORT ======");
        pvVar8 = (void *)std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        poVar7 = std::operator<<(aoStack_12e0,"QLA S/N: ");
        std::operator<<(poVar7,(string *)local_10b8);
        if (portDescription.field_2._12_4_ != 0) {
          poVar7 = std::operator<<(aoStack_12e0," (QLA ");
          poVar7 = (ostream *)std::ostream::operator<<(poVar7,portDescription.field_2._12_4_);
          std::operator<<(poVar7," of DQLA)");
        }
        std::ostream::operator<<(aoStack_12e0,std::endl<char,std::char_traits<char>>);
        uVar4 = BoardIO::GetFpgaVersionMajor((BoardIO *)((long)&logFilename.field_2 + 8));
        if (uVar4 == 3) {
          poVar7 = std::operator<<(aoStack_12e0,"FPGA V3");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
        }
        else {
          FpgaIO::GetFPGASerialNumber_abi_cxx11_
                    ((string *)&console.Internals,(FpgaIO *)((long)&logFilename.field_2 + 8));
          uVar11 = std::__cxx11::string::empty();
          if ((uVar11 & 1) != 0) {
            std::__cxx11::string::assign((char *)&console.Internals);
          }
          poVar7 = std::operator<<(aoStack_12e0,"FPGA S/N: ");
          poVar7 = std::operator<<(poVar7,(string *)&console.Internals);
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&console.Internals);
        }
        poVar7 = std::operator<<(aoStack_12e0,"FPGA Firmware Version: ");
        uVar5 = BoardIO::GetFirmwareVersion((BoardIO *)((long)&logFilename.field_2 + 8));
        pvVar8 = (void *)std::ostream::operator<<(poVar7,uVar5);
        std::ostream::operator<<(pvVar8,std::endl<char,std::char_traits<char>>);
        Amp1394Console::Amp1394Console((Amp1394Console *)&DEBUG_START_LINE,3);
        Amp1394Console::Init((Amp1394Console *)&DEBUG_START_LINE);
        bVar2 = Amp1394Console::IsOK((Amp1394Console *)&DEBUG_START_LINE);
        if (bVar2) {
          uVar12 = std::__cxx11::string::c_str();
          Amp1394Console::Print(1,9,"QLA Test for Board %d, S/N %s",(ulong)local_20,uVar12);
          Amp1394Console::Print(3,9,"0) Quit");
          Amp1394Console::Print(4,9,"1) Test digital input:");
          Amp1394Console::Print(5,9,"2) Test encoder feedback:");
          Amp1394Console::Print(6,9,"3) Test analog feedback:");
          Amp1394Console::Print(7,9,"4) Test motor power control:");
          Amp1394Console::Print(8,9,"5) Test power amplifier:");
          iVar6 = (*local_1f0->_vptr_BasePort[0xf])();
          if (((iVar6 == 0) || (iVar6 = (*local_1f0->_vptr_BasePort[0xf])(), iVar6 == 3)) &&
             (1 < uVar4)) {
            Amp1394Console::Print(9,9,"6) Test Ethernet controller:");
          }
          Amp1394Console::Refresh();
          last_debug_line = 0xc;
          uStack_1320 = 0x14;
          local_1324 = 0x14;
          local_1325 = 0;
          while (((local_1325 ^ 0xff) & 1) != 0) {
            std::__cxx11::stringstream::str();
            bVar1 = std::__cxx11::string::empty();
            std::__cxx11::string::~string(local_1348);
            if (((bVar1 ^ 0xff) & 1) != 0) {
              local_134c = 0x14;
              memset((void *)((long)&stringLine.field_2 + 8),0x20,0x50);
              for (qlaNum = 0x14; (int)qlaNum < local_1324; qlaNum = qlaNum + 1) {
                Amp1394Console::Print(qlaNum,9,stringLine.field_2._M_local_buf + 8);
              }
              while (bVar1 = std::ios::eof(), ((bVar1 ^ 0xff) & 1) != 0) {
                std::__cxx11::string::string(local_13c8);
                std::getline<char,std::char_traits<char>,std::allocator<char>>
                          ((istream *)&Port,local_13c8);
                pcVar9 = (char *)std::__cxx11::string::c_str();
                Amp1394Console::Print(local_134c,9,pcVar9);
                std::__cxx11::string::~string(local_13c8);
                local_134c = local_134c + 1;
              }
              std::ios::clear((long)&Port + *(long *)(Port[-1].Board2Node + 4),0);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>((string *)&c,"",&local_13e9);
              std::__cxx11::stringstream::str((string *)&Port);
              std::__cxx11::string::~string((string *)&c);
              std::allocator<char>::~allocator(&local_13e9);
              local_1324 = local_134c;
            }
            Amp1394Console::Print(10,10,"Select option: ");
            iVar6 = Amp1394Console::GetChar((Amp1394Console *)&DEBUG_START_LINE);
            switch(iVar6) {
            case 0x30:
              local_1325 = 1;
              break;
            case 0x31:
              ClearLines(0xc,0x14);
              bVar2 = TestDigitalInputs(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                        (ofstream *)aoStack_12e0,portDescription.field_2._12_4_);
              if (bVar2) {
                Amp1394Console::Print(4,0x2e,"PASS");
              }
              else {
                Amp1394Console::Print(4,0x2e,"FAIL");
              }
              break;
            case 0x32:
              ClearLines(0xc,0x14);
              bVar2 = TestEncoders(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                   (ofstream *)aoStack_12e0,portDescription.field_2._12_4_);
              if (bVar2) {
                Amp1394Console::Print(5,0x2e,"PASS");
              }
              else {
                Amp1394Console::Print(5,0x2e,"FAIL");
              }
              break;
            case 0x33:
              ClearLines(0xc,0x14);
              bVar2 = TestAnalogInputs(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                       (ofstream *)aoStack_12e0,portDescription.field_2._12_4_);
              if (bVar2) {
                Amp1394Console::Print(6,0x2e,"PASS");
              }
              else {
                Amp1394Console::Print(6,0x2e,"FAIL");
              }
              break;
            case 0x34:
              ClearLines(0xc,0x14);
              bVar2 = TestMotorPowerControl
                                (0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                 (ofstream *)aoStack_12e0,portDescription.field_2._12_4_);
              if (bVar2) {
                Amp1394Console::Print(7,0x2e,"PASS");
              }
              else {
                Amp1394Console::Print(7,0x2e,"FAIL");
              }
              break;
            case 0x35:
              ClearLines(0xc,0x14);
              bVar2 = TestPowerAmplifier(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                         (ofstream *)aoStack_12e0,portDescription.field_2._12_4_);
              if (bVar2) {
                Amp1394Console::Print(8,0x2e,"PASS");
              }
              else {
                Amp1394Console::Print(8,0x2e,"FAIL");
              }
              break;
            case 0x36:
              iVar6 = (*local_1f0->_vptr_BasePort[0xf])();
              if (((iVar6 == 0) || (iVar6 = (*local_1f0->_vptr_BasePort[0xf])(), iVar6 == 3)) &&
                 (1 < uVar4)) {
                ClearLines(0xc,0x14);
                if ((uVar4 == 2) &&
                   (bVar2 = TestEthernetV2(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),local_1f0,
                                           (ofstream *)aoStack_12e0), bVar2)) {
                  Amp1394Console::Print(9,0x2e,"PASS");
                }
                else if ((uVar4 == 3) &&
                        (bVar2 = TestEthernetV3(0xc,(AmpIO *)((long)&logFilename.field_2 + 8),
                                                local_1f0,(ofstream *)aoStack_12e0), bVar2)) {
                  Amp1394Console::Print(9,0x2e,"PASS");
                }
                else {
                  Amp1394Console::Print(9,0x2e,"FAIL");
                }
              }
            }
            Amp1394Console::Refresh();
          }
          (*local_1f0->_vptr_BasePort[0xe])(local_1f0,(ulong)(byte)local_20);
          Amp1394Console::End((Amp1394Console *)&DEBUG_START_LINE);
          if (local_1f0 != (BasePort *)0x0) {
            (*local_1f0->_vptr_BasePort[0xb])();
          }
          local_60 = 0;
        }
        else {
          poVar7 = std::operator<<((ostream *)&std::cerr,"Failed to initialize console");
          std::ostream::operator<<(poVar7,std::endl<char,std::char_traits<char>>);
          (*local_1f0->_vptr_BasePort[0xe])(local_1f0,(ulong)(byte)local_20);
          if (local_1f0 != (BasePort *)0x0) {
            (*local_1f0->_vptr_BasePort[0xb])();
          }
          argv_local._4_4_ = -1;
          local_60 = 1;
        }
        Amp1394Console::~Amp1394Console((Amp1394Console *)&DEBUG_START_LINE);
      }
      std::ofstream::~ofstream(aoStack_12e0);
      std::__cxx11::string::~string((string *)local_10b8);
      std::__cxx11::string::~string(local_1090);
      AmpIO::~AmpIO((AmpIO *)((long)&logFilename.field_2 + 8));
    }
  }
LAB_0010be2f:
  std::__cxx11::stringstream::~stringstream((stringstream *)&Port);
LAB_0010be3b:
  std::__cxx11::string::~string(local_48);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char** argv)
{
    int i;
    int board = 0;
    unsigned int qlaNum = 0;    // QLA number (1 or 2 for DQLA)

    std::string portDescription = BasePort::DefaultPort();

    if (argc > 1) {
        int args_found = 0;
        for (i = 1; i < argc; i++) {
            if (argv[i][0] == '-') {
                if (argv[i][1] == 'p') {
                    portDescription = argv[i]+2;
                }
                else if (argv[i][1] == 'q') {
                    qlaNum = argv[i][2]-'0';
                }
                else {
                    std::cerr << "Usage: qlatest [<board-num>] [-pP] [-qN]" << std::endl
                    << "       where <board-num> = rotary switch setting (0-15, default 0)" << std::endl
                    << "             P = port number (default 0)" << std::endl
                    << "                 can also specify -pfwP, -pethP or -pudp" << std::endl
                    << "             N = QLA number (1 or 2) on DQLA" << std::endl;
                    return 0;
                }
            }
            else {
                if (args_found == 0) {
                    board = atoi(argv[i]);
                    std::cerr << "Selecting board " << board << std::endl;
                }
                args_found++;
            }
        }
    }

    std::stringstream debugStream(std::stringstream::out|std::stringstream::in);
    BasePort *Port = PortFactory(portDescription.c_str(), debugStream);
    if (!Port) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to create port using: " << portDescription << std::endl;
        return -1;
    }
    if (!Port->IsOK()) {
        PrintDebugStream(debugStream);
        std::cerr << "Failed to initialize " << Port->GetPortTypeString() << std::endl;
        return -1;
    }

    bool isDQLA = (Port->GetHardwareVersion(board) == DQLA_String);
    if (isDQLA) {
        if (!((qlaNum == 1) || (qlaNum == 2))) {
            std::cerr << "Must specify -q1 or -q2 to select QLA number for DQLA" << std::endl;
            delete Port;
            return 0;
        }
    }
    else if (qlaNum != 0) {
        // If not DQLA, force qlaNum to 0
        qlaNum = 0;
    }

    AmpIO Board(board);
    Port->AddBoard(&Board);

    std::string logFilename("QLA_");
    std::string QLA_SN = Board.GetQLASerialNumber(qlaNum);
    if (QLA_SN.empty()) {
        std::cerr << "QLA serial number not found. Program now (y/n)? ";
#ifdef _MSC_VER
        char resp = _getch();
#else
        char resp = getchar();
#endif
        std::cerr << std::endl;
        if ((resp == 'y') || (resp == 'Y')) {
            if (PromQLASerialNumberProgram(Board, qlaNum))
                QLA_SN = Board.GetQLASerialNumber(qlaNum);
            else
                std::cerr << "Failed to program QLA serial number" << std::endl;
        }
        if (QLA_SN.empty()) {
            QLA_SN.assign("Unknown");
        }
    }
    logFilename.append(QLA_SN);
    logFilename.append(".log");
    std::ofstream logFile(logFilename.c_str());
    if (!logFile.good()) {
        std::cerr << "Failed to open log file " << logFilename << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return 0;
    }
    logFile << "====== TEST REPORT ======" << std::endl << std::endl;
    logFile << "QLA S/N: " << QLA_SN;
    if (qlaNum != 0)
        logFile << " (QLA " << qlaNum << " of DQLA)";
    logFile << std::endl;

    unsigned int fpgaVer = Board.GetFpgaVersionMajor();
    if (fpgaVer == 3) {
        logFile << "FPGA V3" << std::endl;
    }
    else {
        std::string FPGA_SN = Board.GetFPGASerialNumber();
        if (FPGA_SN.empty())
            FPGA_SN.assign("Unknown");
        logFile << "FPGA S/N: " << FPGA_SN << std::endl;
    }

    logFile << "FPGA Firmware Version: " << Board.GetFirmwareVersion() << std::endl;

    Amp1394Console console(Amp1394Console::FLAG_ECHO|Amp1394Console::FLAG_BLOCKING);
    console.Init();
    if (!console.IsOK()) {
        std::cerr << "Failed to initialize console" << std::endl;
        Port->RemoveBoard(board);
        delete Port;
        return -1;
    }

    console.Print(1, 9, "QLA Test for Board %d, S/N %s", board, QLA_SN.c_str());

    console.Print(3, 9, "0) Quit");
    console.Print(4, 9, "1) Test digital input:");
    console.Print(5, 9, "2) Test encoder feedback:");
    console.Print(6, 9, "3) Test analog feedback:");
    console.Print(7, 9, "4) Test motor power control:");
    console.Print(8, 9, "5) Test power amplifier:");   // includes current feedback & temp sense
    if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
         (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1))
        console.Print(9, 9, "6) Test Ethernet controller:");

    console.Refresh();

    const int TEST_START_LINE = 12;
    const int DEBUG_START_LINE = 20;
    int last_debug_line = DEBUG_START_LINE;

    bool done = false;
    while (!done) {

        if (!debugStream.str().empty()) {
            int cur_line = DEBUG_START_LINE;
            char line[80];
            memset(line, ' ', sizeof(line));
            for (i = cur_line; i < last_debug_line; i++)
                console.Print(i, 9, line);
            while (!debugStream.eof()) {
                std::string stringLine;
                std::getline(debugStream, stringLine);
                console.Print(cur_line++, 9, stringLine.c_str());
            }
            debugStream.clear();
            debugStream.str("");
            last_debug_line = cur_line;
        }

        console.Print(10, 10, "Select option: ");
        int c = console.GetChar();

        switch (c) {
            case '0':   // Quit
                done = true;
                break;
            case '1':   // Test digital input
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestDigitalInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(4, 46, "PASS");
                else
                    console.Print(4, 46, "FAIL");
                break;

            case '2':    // Test encoder feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestEncoders(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(5, 46, "PASS");
                else
                    console.Print(5, 46, "FAIL");
                break;

            case '3':    // Test analog feedback
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestAnalogInputs(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(6, 46, "PASS");
                else
                    console.Print(6, 46, "FAIL");
                break;

            case '4':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestMotorPowerControl(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(7, 46, "PASS");
                else
                    console.Print(7, 46, "FAIL");
                break;

            case '5':
                ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                if (TestPowerAmplifier(TEST_START_LINE, Board, Port, logFile, qlaNum))
                    console.Print(8, 46, "PASS");
                else
                    console.Print(8, 46, "FAIL");
                break;

            case '6':
                 if (((Port->GetPortType() == BasePort::PORT_FIREWIRE) ||
                      (Port->GetPortType() == BasePort::PORT_ZYNQ_EMIO)) && (fpgaVer > 1)) {
                    ClearLines(TEST_START_LINE, DEBUG_START_LINE);
                    if ((fpgaVer == 2) && TestEthernetV2(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else if ((fpgaVer == 3) && TestEthernetV3(TEST_START_LINE, Board, Port, logFile))
                        console.Print(9, 46, "PASS");
                    else
                        console.Print(9, 46, "FAIL");
                }
                break;

        }

        console.Refresh();
    }

    Port->RemoveBoard(board);
    console.End();
    delete Port;
}